

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

vector<int_*,_std::allocator<int_*>_> * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::queryRectangle(vector<int_*,_std::allocator<int_*>_> *__return_storage_ptr__,
                KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,Node *node,int *searchMin,int *searchMax,int *currentRegionMin,
                int *currentRegionMax,uint depth)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int *regionMin;
  int *regionMax;
  int *regionMin_00;
  int *regionMax_00;
  long lVar4;
  ulong uVar5;
  undefined1 local_68 [8];
  vector<int_*,_std::allocator<int_*>_> resultLeft;
  
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (node->left == (Node *)0x0) {
    bVar3 = nodeInSearchRange(this,searchMin,searchMax,node);
    if (bVar3) {
      std::vector<int_*,_std::allocator<int_*>_>::push_back(__return_storage_ptr__,&node->value);
    }
  }
  else {
    resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)searchMax;
    regionMin = (int *)operator_new__(0x14);
    regionMax = (int *)operator_new__(0x14);
    regionMin_00 = (int *)operator_new__(0x14);
    regionMax_00 = (int *)operator_new__(0x14);
    for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
      uVar1 = *(undefined4 *)((long)currentRegionMin + lVar4);
      *(undefined4 *)((long)regionMin + lVar4) = uVar1;
      uVar2 = *(undefined4 *)((long)currentRegionMax + lVar4);
      *(undefined4 *)((long)regionMax + lVar4) = uVar2;
      *(undefined4 *)((long)regionMin_00 + lVar4) = uVar1;
      *(undefined4 *)((long)regionMax_00 + lVar4) = uVar2;
    }
    uVar5 = (ulong)(depth % 5 << 2);
    uVar1 = *(undefined4 *)((long)node->value + uVar5);
    *(undefined4 *)((long)regionMax + uVar5) = uVar1;
    *(undefined4 *)((long)regionMin_00 + uVar5) = uVar1;
    bVar3 = regionContained(this,searchMin,
                            (int *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,regionMin,
                            regionMax);
    if (bVar3) {
      reportSubtree(this,node->left,__return_storage_ptr__);
    }
    else {
      bVar3 = regionIntersects(this,searchMin,
                               (int *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,regionMin,
                               regionMax);
      if (bVar3) {
        queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_68,this,node->left,searchMin,
                       (int *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,regionMin,regionMax,
                       depth + 1);
        std::vector<int*,std::allocator<int*>>::
        insert<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
                  ((vector<int*,std::allocator<int*>> *)__return_storage_ptr__,
                   (const_iterator)
                   (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)local_68,
                   (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                   resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
                  ((_Vector_base<int_*,_std::allocator<int_*>_> *)local_68);
      }
    }
    bVar3 = regionContained(this,searchMin,
                            (int *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,regionMin_00,
                            regionMax_00);
    if (bVar3) {
      reportSubtree(this,node->right,__return_storage_ptr__);
    }
    else {
      bVar3 = regionIntersects(this,searchMin,
                               (int *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,regionMin_00
                               ,regionMax_00);
      if (bVar3) {
        queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_68,this,node->right,searchMin,
                       (int *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,regionMin_00,regionMax_00,
                       depth + 1);
        std::vector<int*,std::allocator<int*>>::
        insert<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
                  ((vector<int*,std::allocator<int*>> *)__return_storage_ptr__,
                   (const_iterator)
                   (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)local_68,
                   (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>)
                   resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
                  ((_Vector_base<int_*,_std::allocator<int_*>_> *)local_68);
      }
    }
    default_delete<int>::operator()((default_delete<int> *)local_68,regionMin);
    default_delete<int>::operator()((default_delete<int> *)local_68,regionMax);
    default_delete<int>::operator()((default_delete<int> *)local_68,regionMin_00);
    default_delete<int>::operator()((default_delete<int> *)local_68,regionMax_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(Node * const node, T * const searchMin, T * const searchMax, T * const currentRegionMin, T * const currentRegionMax, const unsigned int depth) const {
			std::vector<T*> result;

			// if node->left == nullptr then also node->right == nullptr.
			// this means we reached a leaf of the tree
			if (node->left == nullptr) {
				// if the leaf is within the search range, add it to the result vector
				if (nodeInSearchRange(searchMin, searchMax, node)) {
					result.push_back(node->value);
				}
			}
			else {
				T *leftRegionMin = NEW()();
				T *leftRegionMax = NEW()();
				T *rightRegionMin = NEW()();
				T *rightRegionMax = NEW()();

				for (int i = 0; i < dim; i++) {
					SET()(leftRegionMin, currentRegionMin, i);
					SET()(leftRegionMax, currentRegionMax, i);
					SET()(rightRegionMin, currentRegionMin, i);
					SET()(rightRegionMax, currentRegionMax, i);
				}

				SET()(leftRegionMax, node->value, depth%dim);
				SET()(rightRegionMin, node->value, depth%dim);

				if (regionContained(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
					reportSubtree(node->left, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
						std::vector<T*> resultLeft = queryRectangle(node->left, searchMin, searchMax, leftRegionMin, leftRegionMax, depth + 1);
						result.insert(result.end(), resultLeft.begin(), resultLeft.end());
					}
				}

				if (regionContained(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
					reportSubtree(node->right, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
						std::vector<T*> resultRight = queryRectangle(node->right, searchMin, searchMax, rightRegionMin, rightRegionMax, depth + 1);
						result.insert(result.end(), resultRight.begin(), resultRight.end());
					}
				}

				DELETE()(leftRegionMin);
				DELETE()(leftRegionMax);
				DELETE()(rightRegionMin);
				DELETE()(rightRegionMax);
			}
			return result;
		}